

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O1

int session_send_detach(LINK_ENDPOINT_HANDLE link_endpoint,DETACH_HANDLE detach)

{
  int iVar1;
  AMQP_VALUE performative;
  LINK_ENDPOINT_INSTANCE *link_endpoint_instance;
  int iVar2;
  
  iVar2 = 0x582;
  if (detach != (DETACH_HANDLE)0x0 && link_endpoint != (LINK_ENDPOINT_HANDLE)0x0) {
    iVar1 = detach_set_handle(detach,link_endpoint->output_handle);
    iVar2 = 0x58a;
    if (iVar1 == 0) {
      performative = amqpvalue_create_detach(detach);
      if (performative == (AMQP_VALUE)0x0) {
        iVar2 = 0x591;
      }
      else {
        iVar1 = connection_encode_frame
                          (link_endpoint->session->endpoint,performative,(PAYLOAD *)0x0,0,
                           (ON_SEND_COMPLETE)0x0,(void *)0x0);
        iVar2 = 0x597;
        if (iVar1 == 0) {
          iVar2 = 0;
        }
        amqpvalue_destroy(performative);
      }
    }
  }
  return iVar2;
}

Assistant:

int session_send_detach(LINK_ENDPOINT_HANDLE link_endpoint, DETACH_HANDLE detach)
{
    int result;

    if ((link_endpoint == NULL) ||
        (detach == NULL))
    {
        result = MU_FAILURE;
    }
    else
    {
        LINK_ENDPOINT_INSTANCE* link_endpoint_instance = (LINK_ENDPOINT_INSTANCE*)link_endpoint;

        if (detach_set_handle(detach, link_endpoint_instance->output_handle) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            AMQP_VALUE detach_performative_value = amqpvalue_create_detach(detach);
            if (detach_performative_value == NULL)
            {
                result = MU_FAILURE;
            }
            else
            {
                if (encode_frame(link_endpoint, detach_performative_value, NULL, 0) != 0)
                {
                    result = MU_FAILURE;
                }
                else
                {
                    result = 0;
                }

                amqpvalue_destroy(detach_performative_value);
            }
        }
    }

    return result;
}